

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.h
# Opt level: O0

void __thiscall QDebug::Stream::Stream(Stream *this,QString *string)

{
  long lVar1;
  QFlags<QIODeviceBase::OpenModeFlag> *in_RSI;
  QTextStream *in_RDI;
  long in_FS_OFFSET;
  OpenModeFlag in_stack_ffffffffffffffcc;
  uint local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags(in_RSI,in_stack_ffffffffffffffcc);
  QTextStream::QTextStream(in_RDI,(QString *)in_RSI,(QFlags_conflict *)(ulong)local_c);
  QString::QString((QString *)0x721d74);
  *(undefined4 *)(in_RDI + 0x28) = 1;
  *(undefined4 *)(in_RDI + 0x2c) = 0;
  in_RDI[0x30] = (QTextStream)0x1;
  in_RDI[0x31] = (QTextStream)0x0;
  in_RDI[0x32] = (QTextStream)0x0;
  *(undefined4 *)(in_RDI + 0x34) = 2;
  QMessageLogContext::QMessageLogContext((QMessageLogContext *)(in_RDI + 0x38));
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit Stream(QString *string)
            : ts(string, WriteOnly)
        {}